

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_currency.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::CombinedCurrencyMatcher::match
          (CombinedCurrencyMatcher *this,StringSegment *segment,ParsedNumber *result,
          UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  
  if (result->currencyCode[0] != L'\0') {
    return false;
  }
  iVar4 = StringSegment::getOffset(segment);
  bVar2 = ParsedNumber::seenNumber(result);
  if ((bVar2) && (0x1f < (ushort)(this->beforeSuffixInsert).fUnion.fStackFields.fLengthAndFlags)) {
    iVar5 = StringSegment::getCommonPrefixLength(segment,&this->beforeSuffixInsert);
    sVar1 = (this->beforeSuffixInsert).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (this->beforeSuffixInsert).fUnion.fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (iVar5 == iVar7) {
      StringSegment::adjustOffset(segment,iVar5);
    }
    iVar6 = StringSegment::length(segment);
    bVar2 = true;
    if (iVar5 == iVar6) goto LAB_002764d2;
  }
  bVar2 = matchCurrency(this,segment,result,status);
LAB_002764d2:
  if (result->currencyCode[0] == L'\0') {
    StringSegment::setOffset(segment,iVar4);
  }
  else {
    bVar3 = ParsedNumber::seenNumber(result);
    if ((!bVar3) && (0x1f < (ushort)(this->afterPrefixInsert).fUnion.fStackFields.fLengthAndFlags))
    {
      iVar4 = StringSegment::getCommonPrefixLength(segment,&this->afterPrefixInsert);
      sVar1 = (this->afterPrefixInsert).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar7 = (this->afterPrefixInsert).fUnion.fFields.fLength;
      }
      else {
        iVar7 = (int)sVar1 >> 5;
      }
      if (iVar4 == iVar7) {
        StringSegment::adjustOffset(segment,iVar4);
      }
      bVar3 = bVar2 == false;
      bVar2 = true;
      if (bVar3) {
        iVar5 = StringSegment::length(segment);
        bVar2 = iVar4 == iVar5;
      }
    }
  }
  return bVar2;
}

Assistant:

bool
CombinedCurrencyMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    if (result.currencyCode[0] != 0) {
        return false;
    }

    // Try to match a currency spacing separator.
    int32_t initialOffset = segment.getOffset();
    bool maybeMore = false;
    if (result.seenNumber() && !beforeSuffixInsert.isEmpty()) {
        int32_t overlap = segment.getCommonPrefixLength(beforeSuffixInsert);
        if (overlap == beforeSuffixInsert.length()) {
            segment.adjustOffset(overlap);
            // Note: let currency spacing be a weak match. Don't update chars consumed.
        }
        maybeMore = maybeMore || overlap == segment.length();
    }

    // Match the currency string, and reset if we didn't find one.
    maybeMore = maybeMore || matchCurrency(segment, result, status);
    if (result.currencyCode[0] == 0) {
        segment.setOffset(initialOffset);
        return maybeMore;
    }

    // Try to match a currency spacing separator.
    if (!result.seenNumber() && !afterPrefixInsert.isEmpty()) {
        int32_t overlap = segment.getCommonPrefixLength(afterPrefixInsert);
        if (overlap == afterPrefixInsert.length()) {
            segment.adjustOffset(overlap);
            // Note: let currency spacing be a weak match. Don't update chars consumed.
        }
        maybeMore = maybeMore || overlap == segment.length();
    }

    return maybeMore;
}